

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_IteratorNext2(JSContext *ctx,JSValue enum_obj,JSValue method,int argc,JSValue *argv,
                        int *pdone)

{
  JSValue this_obj;
  JSValue func_obj;
  JSValue JVar1;
  int iVar2;
  JSValueUnion in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  JSContext *in_RDI;
  int64_t in_R8;
  int in_R9D;
  undefined1 auVar3 [16];
  JSValue JVar4;
  undefined1 *in_stack_00000008;
  undefined4 *in_stack_00000010;
  JSValue args [1];
  JSCFunctionType func;
  JSObject *p;
  JSValue obj;
  undefined8 in_stack_ffffffffffffff48;
  undefined4 uVar5;
  JSContext *in_stack_ffffffffffffff50;
  JSValue in_stack_ffffffffffffff58;
  int64_t local_90;
  int in_stack_ffffffffffffff7c;
  JSContext *in_stack_ffffffffffffff80;
  JSValueUnion in_stack_ffffffffffffff88;
  int64_t in_stack_ffffffffffffff90;
  JSValueUnion in_stack_ffffffffffffff98;
  int64_t in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 local_10;
  undefined4 uStack_c;
  int64_t local_8;
  
  uVar5 = (undefined4)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  JVar4.tag = in_R8;
  JVar4.u.ptr = in_RCX.ptr;
  iVar2 = JS_IsObject(JVar4);
  if (((iVar2 == 0) || (*(short *)((long)in_RCX.ptr + 6) != 0xc)) ||
     (*(char *)((long)in_RCX.ptr + 0x41) != '\f')) {
    func_obj.tag = in_stack_ffffffffffffffa0;
    func_obj.u.float64 = in_stack_ffffffffffffff98.float64;
    this_obj.tag = in_stack_ffffffffffffff90;
    this_obj.u.float64 = in_stack_ffffffffffffff88.float64;
    JVar4 = JS_Call(in_stack_ffffffffffffff80,func_obj,this_obj,in_stack_ffffffffffffff7c,
                    (JSValue *)CONCAT44(in_R9D,in_stack_ffffffffffffffc0));
    local_90 = JVar4.tag;
    iVar2 = JS_IsException(JVar4);
    if (iVar2 == 0) {
      iVar2 = JS_IsObject(JVar4);
      if (iVar2 != 0) {
        *in_stack_00000010 = 2;
        local_10 = JVar4.u._0_4_;
        uStack_c = JVar4.u._4_4_;
        local_8 = local_90;
        goto LAB_001665b0;
      }
      JS_FreeValue(in_stack_ffffffffffffff50,in_stack_ffffffffffffff58);
      JS_ThrowTypeError(in_RDI,"iterator must return an object");
    }
    *in_stack_00000010 = 0;
    local_10 = 0;
    local_8 = 6;
  }
  else {
    if (in_R9D == 0) {
      in_stack_00000008 = &stack0xffffffffffffff88;
    }
    auVar3 = (**(code **)((long)in_RCX.ptr + 0x38))
                       (in_RDI,in_RSI,in_RDX,in_R9D,in_stack_00000008,in_stack_00000010,
                        CONCAT44(uVar5,(int)*(short *)((long)in_RCX.ptr + 0x42)));
    local_8 = auVar3._8_8_;
    local_10 = auVar3._0_4_;
    uStack_c = auVar3._4_4_;
  }
LAB_001665b0:
  JVar1.u._4_4_ = uStack_c;
  JVar1.u.int32 = local_10;
  JVar1.tag = local_8;
  return JVar1;
}

Assistant:

static JSValue JS_IteratorNext2(JSContext *ctx, JSValueConst enum_obj,
                                JSValueConst method,
                                int argc, JSValueConst *argv, int *pdone)
{
    JSValue obj;

    /* fast path for the built-in iterators (avoid creating the
       intermediate result object) */
    if (JS_IsObject(method)) {
        JSObject *p = JS_VALUE_GET_OBJ(method);
        if (p->class_id == JS_CLASS_C_FUNCTION &&
            p->u.cfunc.cproto == JS_CFUNC_iterator_next) {
            JSCFunctionType func;
            JSValueConst args[1];

            /* in case the function expects one argument */
            if (argc == 0) {
                args[0] = JS_UNDEFINED;
                argv = args;
            }
            func = p->u.cfunc.c_function;
            return func.iterator_next(ctx, enum_obj, argc, argv,
                                      pdone, p->u.cfunc.magic);
        }
    }
    obj = JS_Call(ctx, method, enum_obj, argc, argv);
    if (JS_IsException(obj))
        goto fail;
    if (!JS_IsObject(obj)) {
        JS_FreeValue(ctx, obj);
        JS_ThrowTypeError(ctx, "iterator must return an object");
        goto fail;
    }
    *pdone = 2;
    return obj;
 fail:
    *pdone = FALSE;
    return JS_EXCEPTION;
}